

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O3

void Dither8x8(VP8Random *rg,uint8_t *dst,int bps,int amp)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint8_t dither [64];
  uint8_t local_48 [72];
  
  uVar5 = rg->index1_;
  uVar6 = rg->index2_;
  lVar3 = 0;
  do {
    uVar4 = rg->tab_[(int)uVar5] - rg->tab_[(int)uVar6];
    rg->tab_[(int)uVar5] = uVar4 & 0x7fffffff;
    uVar1 = rg->index1_;
    uVar2 = rg->index2_;
    uVar5 = ~-(uint)(uVar1 + 1 == 0x37) & uVar1 + 1;
    uVar6 = ~-(uint)(uVar2 + 1 == 0x37) & uVar2 + 1;
    rg->index1_ = uVar5;
    rg->index2_ = uVar6;
    local_48[lVar3] = (char)((uint)((char)(uVar4 >> 0x17) * amp) >> 8) + 0x80;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x40);
  (*VP8DitherCombine8x8)(local_48,dst,bps);
  return;
}

Assistant:

static void Dither8x8(VP8Random* const rg, uint8_t* dst, int bps, int amp) {
  uint8_t dither[64];
  int i;
  for (i = 0; i < 8 * 8; ++i) {
    dither[i] = VP8RandomBits2(rg, VP8_DITHER_AMP_BITS + 1, amp);
  }
  VP8DitherCombine8x8(dither, dst, bps);
}